

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.cpp
# Opt level: O0

int luaB_loadstring(lua_State *L)

{
  size_t L_00;
  int iVar1;
  char *def;
  char *name;
  char *chunkname;
  char *s;
  size_t l;
  lua_State *L_local;
  
  l = (size_t)L;
  def = luaL_checklstring(L,1,(size_t *)&s);
  name = luaL_optlstring((lua_State *)l,2,def,(size_t *)0x0);
  L_00 = l;
  iVar1 = luaL_loadbuffer((lua_State *)l,def,(size_t)s,name);
  iVar1 = load_aux((lua_State *)L_00,iVar1);
  return iVar1;
}

Assistant:

static int luaB_loadstring (lua_State *L) {
  size_t l;
  const char *s = luaL_checklstring(L, 1, &l);
  const char *chunkname = luaL_optstring(L, 2, s);
  return load_aux(L, luaL_loadbuffer(L, s, l, chunkname));
}